

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

bool __thiscall
qclab::dense::SquareMatrix<std::complex<float>_>::operator==
          (SquareMatrix<std::complex<float>_> *this,SquareMatrix<std::complex<float>_> *other)

{
  bool bVar1;
  int64_t iVar2;
  complex<float> *__x;
  complex<float> *__y;
  long local_30;
  size_type_conflict i;
  size_type_conflict j;
  SquareMatrix<std::complex<float>_> *other_local;
  SquareMatrix<std::complex<float>_> *this_local;
  
  iVar2 = size(other);
  if (iVar2 == this->size_) {
    for (i = 0; i < this->size_; i = i + 1) {
      for (local_30 = 0; local_30 < this->size_; local_30 = local_30 + 1) {
        __x = operator()(other,local_30,i);
        __y = operator()(this,local_30,i);
        bVar1 = std::operator!=(__x,__y);
        if (bVar1) {
          return false;
        }
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool operator==( const SquareMatrix< T >& other ) const {
          if ( other.size() != size_ ) return false ;
          for ( size_type j = 0; j < size_; j++ ) {
            for ( size_type i = 0; i < size_; i++ ) {
              if ( other(i,j) != (*this)(i,j) ) return false ;
            }
          }
          return true ;
        }